

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

int linklist_5_3::get_common_arr(int *a,int n1,int *b,int n2)

{
  int iVar1;
  sqlist_5_3 *this;
  int *piVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  undefined4 in_register_00000034;
  ulong uVar6;
  
  iVar5 = n1;
  this = (sqlist_5_3 *)malloc(0x10);
  *(undefined8 *)(this + 8) = 0;
  iVar3 = 0;
  uVar6 = 0;
  piVar4 = (int *)0x0;
LAB_00101ce8:
  do {
    uVar6 = (ulong)(int)uVar6;
    while( true ) {
      if ((n1 <= (int)uVar6) || (n2 <= iVar3)) {
        sqlist_5_3::test_1(this,(LinkList)CONCAT44(in_register_00000034,iVar5));
      }
      iVar1 = a[uVar6];
      if (iVar1 == b[iVar3]) {
        piVar2 = (int *)malloc(0x10);
        *piVar2 = iVar1;
        *(int **)(piVar2 + 2) = piVar4;
        *(int **)(this + 8) = piVar2;
        uVar6 = (ulong)((int)uVar6 + 1);
        iVar3 = iVar3 + 1;
        piVar4 = piVar2;
        goto LAB_00101ce8;
      }
      if (b[iVar3] <= iVar1) break;
      uVar6 = uVar6 + 1;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int get_common_arr(int *a, int n1, int *b, int n2) {
        int i = 0, j = 0;
        LinkList list = newNode, p, q;
        list->next = nullptr;
        q = list;
        while (i < n1 && j < n2) {
            if (a[i] == b[j]) {
                p = newNode;
                p->data = a[i];
//                q->next = p;
//                q = p;
                p->next = q->next;
                q->next = p;
                i++;
                j++;
            } else if (a[i] < b[j]) {
                i++;
            } else {
                j++;
            }
        }
        ps_link_list(list);
        ps_link_list(q);
    }